

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::FreeInput(Codec *this)

{
  void *in_RDI;
  
  if ((*(long *)((long)in_RDI + 0x40) != 0) && (*(long *)((long)in_RDI + 0x30) != 0)) {
    SIMDSafeFree(in_RDI);
    *(undefined8 *)((long)in_RDI + 0x30) = 0;
  }
  *(undefined8 *)((long)in_RDI + 0x40) = 0;
  return;
}

Assistant:

void Codec::FreeInput()
{
    if (_input_allocated > 0 &&
        _input_blocks != nullptr)
    {
        SIMDSafeFree(_input_blocks);
        _input_blocks = nullptr;
    }

    _input_allocated = 0;
}